

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void prvTidyPPrintXMLTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  ulong uVar1;
  TidyParserMemory data;
  Parser *node_00;
  GetTokenMode indent_00;
  int iVar2;
  Bool BVar3;
  bool bVar4;
  Bool mixed_1;
  Node *close_node;
  TidyParserMemory memory_1;
  uint cindent;
  Bool mixed;
  Node *content;
  undefined8 uStack_60;
  uint spaces;
  TidyParserMemory memory;
  Node *next;
  Node *pNStack_20;
  Bool xhtmlOut;
  Node *node_local;
  uint indent_local;
  uint mode_local;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x62].v;
  pNStack_20 = node;
  node_local._0_4_ = indent;
LAB_0015daef:
  if (pNStack_20 == (Node *)0x0) {
    return;
  }
  memory._40_8_ = pNStack_20->next;
  if (doc->progressCallback != (TidyPPProgress)0x0) {
    (*doc->progressCallback)
              ((TidyDoc)doc,pNStack_20->line,pNStack_20->column,(doc->pprint).line + 1);
  }
  if (pNStack_20->type == TextNode) {
    PPrintText(doc,mode,(GetTokenMode)node_local,pNStack_20);
  }
  else {
    if (pNStack_20->type == RootNode) {
      if (pNStack_20->content == (Node *)0x0) {
        return;
      }
      pNStack_20 = pNStack_20->content;
      goto LAB_0015daef;
    }
    if (pNStack_20->type == CommentTag) {
      PCondFlushLineSmart(doc,(GetTokenMode)node_local);
      PPrintComment(doc,(GetTokenMode)node_local,pNStack_20);
    }
    else if (pNStack_20->type == DocTypeTag) {
      PPrintDocType(doc,(GetTokenMode)node_local,pNStack_20);
    }
    else if (pNStack_20->type == ProcInsTag) {
      PPrintPI(doc,(GetTokenMode)node_local,pNStack_20);
    }
    else if (pNStack_20->type == XmlDecl) {
      PPrintXmlDecl(doc,(GetTokenMode)node_local,pNStack_20);
    }
    else if (pNStack_20->type == CDATATag) {
      PPrintCDATA(doc,(GetTokenMode)node_local,pNStack_20);
    }
    else if (pNStack_20->type == SectionTag) {
      PPrintSection(doc,(GetTokenMode)node_local,pNStack_20);
    }
    else if (pNStack_20->type == AspTag) {
      PPrintAsp(doc,(GetTokenMode)node_local,pNStack_20);
    }
    else if (pNStack_20->type == JsteTag) {
      PPrintJste(doc,(GetTokenMode)node_local,pNStack_20);
    }
    else if (pNStack_20->type == PhpTag) {
      PPrintPhp(doc,(GetTokenMode)node_local,pNStack_20);
    }
    else {
      BVar3 = prvTidynodeHasCM(pNStack_20,1);
      if ((BVar3 == no) && ((pNStack_20->type != StartEndTag || ((int)uVar1 != 0)))) {
        if (pNStack_20->type == RootNode) goto LAB_0015de68;
        memset(&stack0xffffffffffffffa0,0,0x30);
        iVar2 = (int)(doc->config).value[0x26].v;
        memory_1._44_4_ = 0;
        for (_cindent = pNStack_20->content; _cindent != (Node *)0x0; _cindent = _cindent->next) {
          BVar3 = prvTidynodeIsText(_cindent);
          if (BVar3 != no) {
            memory_1._44_4_ = 1;
            break;
          }
        }
        PCondFlushLineSmart(doc,(GetTokenMode)node_local);
        BVar3 = prvTidyXMLPreserveWhiteSpace(doc,pNStack_20);
        if (BVar3 == no) {
          if (memory_1._44_4_ == 0) {
            memory_1.register_2 = (GetTokenMode)node_local + iVar2;
          }
          else {
            memory_1.register_2 = (GetTokenMode)node_local;
          }
        }
        else {
          node_local._0_4_ = IgnoreWhitespace;
          memory_1._44_4_ = 0;
          memory_1.register_2 = 0;
        }
        PPrintTag(doc,mode,(GetTokenMode)node_local,pNStack_20);
        if ((memory_1._44_4_ == 0) && (pNStack_20->content != (Node *)0x0)) {
          PFlushLineSmart(doc,memory_1.register_2);
        }
        memory.identity = (Parser *)pNStack_20;
        memory.original_node = (Node *)memory._40_8_;
        memory.reentry_state = memory_1._44_4_;
        memory.mode = (GetTokenMode)node_local;
        data.register_1 = memory_1._44_4_;
        data.mode = memory.reentry_mode;
        data._44_4_ = memory.register_1;
        data.register_2 = (GetTokenMode)node_local;
        data.original_node = pNStack_20;
        data.identity = (Parser *)uStack_60;
        data.reentry_node = (Node *)memory._40_8_;
        data._24_8_ = memory.reentry_node;
        prvTidypushMemory(doc,data);
        if ((GetTokenMode)node_local < (uint)(iVar2 * 0x32)) {
          node_local._0_4_ = memory_1.register_2;
        }
        if (pNStack_20->content != (Node *)0x0) {
          pNStack_20 = pNStack_20->content;
          goto LAB_0015daef;
        }
      }
      else {
        PCondFlushLineSmart(doc,(GetTokenMode)node_local);
        PPrintTag(doc,mode,(GetTokenMode)node_local,pNStack_20);
      }
    }
  }
LAB_0015de68:
  if (memory._40_8_ == 0) {
    BVar3 = prvTidyisEmptyParserStack(doc);
    if (BVar3 == no) {
      do {
        prvTidypopMemory((TidyParserMemory *)&close_node,doc);
        indent_00 = memory_1.mode;
        node_00 = memory_1.identity;
        node_local._0_4_ = memory_1.mode;
        if ((memory_1.reentry_state == 0) && (*(long *)(memory_1.identity + 0x18) != 0)) {
          PCondFlushLineSmart(doc,memory_1.mode);
        }
        PPrintEndTag(doc,mode,indent_00,(Node *)node_00);
        pNStack_20 = memory_1.original_node;
        bVar4 = false;
        if (memory_1.original_node == (Node *)0x0) {
          BVar3 = prvTidyisEmptyParserStack(doc);
          bVar4 = BVar3 == no;
        }
      } while (bVar4);
    }
    else {
      pNStack_20 = (Node *)0x0;
    }
  }
  else {
    pNStack_20 = (Node *)memory._40_8_;
  }
  goto LAB_0015daef;
}

Assistant:

void TY_(PPrintXMLTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    Node* next = NULL;
    
    while ( node  )
    {
        next = node->next;
        
        if (doc->progressCallback)
        {
            doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
        }
        
        if ( node->type == TextNode)
        {
            PPrintText( doc, mode, indent, node );
        }
        else if ( node->type == RootNode )
        {
            if (node->content) {
                node = node->content;
                continue;
            } else {
                break;
            }
        }
        else if ( node->type == CommentTag )
        {
            PCondFlushLineSmart( doc, indent );
            PPrintComment( doc, indent, node);
            /* PCondFlushLine( doc, 0 ); */
        }
        else if ( node->type == DocTypeTag )
            PPrintDocType( doc, indent, node );
        else if ( node->type == ProcInsTag )
            PPrintPI( doc, indent, node );
        else if ( node->type == XmlDecl )
            PPrintXmlDecl( doc, indent, node );
        else if ( node->type == CDATATag )
            PPrintCDATA( doc, indent, node );
        else if ( node->type == SectionTag )
            PPrintSection( doc, indent, node );
        else if ( node->type == AspTag )
            PPrintAsp( doc, indent, node );
        else if ( node->type == JsteTag)
            PPrintJste( doc, indent, node );
        else if ( node->type == PhpTag)
            PPrintPhp( doc, indent, node );
        else if ( TY_(nodeHasCM)(node, CM_EMPTY) ||
                  (node->type == StartEndTag && !xhtmlOut) )
        {
            PCondFlushLineSmart( doc, indent );
            PPrintTag( doc, mode, indent, node );
            /* TY_(PFlushLine)( doc, indent ); */
        }
        else if ( node->type != RootNode )  /* some kind of container element */
        {
            TidyParserMemory memory = {0};
            uint spaces = cfg( doc, TidyIndentSpaces );
            Node *content;
            Bool mixed = no;
            uint cindent;

            for ( content = node->content; content; content = content->next )
            {
                if ( TY_(nodeIsText)(content) )
                {
                    mixed = yes;
                    break;
                }
            }

            PCondFlushLineSmart( doc, indent );

            if ( TY_(XMLPreserveWhiteSpace)(doc, node) )
            {
                indent = 0;
                mixed = no;
                cindent = 0;
            }
            else if (mixed)
                cindent = indent;
            else
                cindent = indent + spaces;

            PPrintTag( doc, mode, indent, node );
            if ( !mixed && node->content )
                PFlushLineSmart( doc, cindent );
     
            memory.original_node = node;
            memory.reentry_node = next;
            memory.register_1 = mixed;
            memory.register_2 = indent;
            TY_(pushMemory)(doc, memory);

            /* Prevent infinite indentation. Seriously, at what point is
               anyone going to read a file with infinite indentation? It
               slows down rendering for arbitrarily-deep test cases that
               are only meant to crash Tidy in the first place. Let's
               consider whether to remove this limitation, lower it,
               increase it, or add a new configuration option to control
               it, or even emit an info-level message about it.
             */
            if (indent < TIDY_INDENTATION_LIMIT * spaces)
                indent = cindent;

            if (node->content)
            {
                node = node->content;
                continue;
            }
        }
        
        if (next)
        {
            node = next;
            continue;
        }
        
        if ( TY_(isEmptyParserStack)(doc) == no )
        {
            /* It's possible that the reentry_node is null, because we
               only pushed this record as a marker for the end tag while
               there was no next node. Thus the loop will pop until we have
               what we need. This also closes multiple end tags.
             */
            do {
                TidyParserMemory memory = TY_(popMemory)(doc);
                Node* close_node = memory.original_node;
                Bool mixed = memory.register_1;
                indent = memory.register_2;
                
                if ( !mixed && close_node->content )
                    PCondFlushLineSmart( doc, indent );

                PPrintEndTag( doc, mode, indent, close_node );
                /* PCondFlushLine( doc, indent ); */
           
                node = memory.reentry_node;
            } while ( node == NULL && TY_(isEmptyParserStack)(doc) == no );
            continue;;
        }
        node = NULL;
    } /* while */
}